

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O3

void ym2203_update_one(void *chip,UINT32 length,DEV_SMPL **buffer)

{
  FM_OPN *OPN;
  FM_CH *CH;
  FM_CH *CH_00;
  FM_CH *CH_01;
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  UINT8 UVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int chnum;
  int chnum_00;
  UINT8 *extraout_RDX;
  UINT8 *extraout_RDX_00;
  UINT8 *pUVar11;
  UINT8 *extraout_RDX_01;
  UINT8 *extraout_RDX_02;
  UINT8 *extraout_RDX_03;
  ulong uVar12;
  UINT8 UVar13;
  FM_SLOT *SLOT;
  DEV_SMPL *local_48;
  DEV_SMPL *local_40;
  
  OPN = (FM_OPN *)((long)chip + 0x108);
  if (buffer == (DEV_SMPL **)0x0) {
    local_40 = (DEV_SMPL *)0x0;
    local_48 = (DEV_SMPL *)0x0;
  }
  else {
    local_48 = *buffer;
    local_40 = buffer[1];
  }
  CH = (FM_CH *)((long)chip + 0x4678);
  CH_00 = (FM_CH *)((long)chip + 0x4810);
  CH_01 = (FM_CH *)((long)chip + 0x49a8);
  refresh_fc_eg_chan(OPN,CH);
  refresh_fc_eg_chan(OPN,CH_00);
  if ((*(byte *)((long)chip + 0x130) & 0xc0) == 0) {
    refresh_fc_eg_chan(OPN,CH_01);
    pUVar11 = extraout_RDX_00;
  }
  else {
    pUVar11 = extraout_RDX;
    if (*(int *)((long)chip + 0x49d0) == -1) {
      iVar8 = *(int *)(*(long *)((long)chip + 0x49a8) + (ulong)*(byte *)((long)chip + 0x58e) * 4) +
              *(int *)((long)chip + 0x584);
      if (iVar8 < 0) {
        iVar8 = iVar8 + *(int *)((long)chip + 0x45e8);
      }
      *(uint *)((long)chip + 0x49d0) = (uint)(iVar8 * *(int *)((long)chip + 0x49c8)) >> 1;
      bVar3 = *(byte *)((long)chip + 0x58e) >> (*(byte *)((long)chip + 0x49b0) & 0x1f);
      uVar4 = (uint)bVar3;
      if (uVar4 != *(byte *)((long)chip + 0x49c4)) {
        *(byte *)((long)chip + 0x49c4) = bVar3;
        uVar10 = *(int *)((long)chip + 0x49b4) + uVar4;
        if (uVar10 < 0x5e) {
          UVar7 = "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                  [uVar10];
          UVar13 = eg_rate_select[uVar10];
        }
        else {
          UVar13 = 0x90;
          UVar7 = '\0';
        }
        *(UINT8 *)((long)chip + 0x49e8) = UVar7;
        *(UINT8 *)((long)chip + 0x49e9) = UVar13;
        uVar10 = *(int *)((long)chip + 0x49b8) + uVar4;
        *(UINT8 *)((long)chip + 0x49ea) =
             "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
             [uVar10];
        *(UINT8 *)((long)chip + 0x49eb) = eg_rate_select[uVar10];
        uVar10 = *(int *)((long)chip + 0x49bc) + uVar4;
        *(UINT8 *)((long)chip + 0x49ec) =
             "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
             [uVar10];
        pUVar11 = (UINT8 *)(ulong)CONCAT31((int3)(uVar10 >> 8),eg_rate_select[uVar10]);
        *(UINT8 *)((long)chip + 0x49ed) = eg_rate_select[uVar10];
        uVar4 = uVar4 + *(int *)((long)chip + 0x49c0);
        *(UINT8 *)((long)chip + 0x49ee) =
             "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
             [uVar4];
        *(UINT8 *)((long)chip + 0x49ef) = eg_rate_select[uVar4];
      }
      iVar8 = *(int *)(*(long *)((long)chip + 0x4a48) + (ulong)*(byte *)((long)chip + 0x58f) * 4) +
              *(int *)((long)chip + 0x588);
      if (iVar8 < 0) {
        iVar8 = iVar8 + *(int *)((long)chip + 0x45e8);
      }
      *(uint *)((long)chip + 0x4a70) = (uint)(iVar8 * *(int *)((long)chip + 0x4a68)) >> 1;
      bVar3 = *(byte *)((long)chip + 0x58f) >> (*(byte *)((long)chip + 0x4a50) & 0x1f);
      uVar4 = (uint)bVar3;
      if (uVar4 != *(byte *)((long)chip + 0x4a64)) {
        *(byte *)((long)chip + 0x4a64) = bVar3;
        uVar10 = *(int *)((long)chip + 0x4a54) + uVar4;
        if (uVar10 < 0x5e) {
          UVar7 = "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                  [uVar10];
          UVar13 = eg_rate_select[uVar10];
        }
        else {
          UVar13 = 0x90;
          UVar7 = '\0';
        }
        *(UINT8 *)((long)chip + 0x4a88) = UVar7;
        *(UINT8 *)((long)chip + 0x4a89) = UVar13;
        uVar10 = *(int *)((long)chip + 0x4a58) + uVar4;
        pUVar11 = 
        "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
        ;
        *(UINT8 *)((long)chip + 0x4a8a) =
             "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
             [uVar10];
        *(UINT8 *)((long)chip + 0x4a8b) = eg_rate_select[uVar10];
        uVar10 = *(int *)((long)chip + 0x4a5c) + uVar4;
        *(UINT8 *)((long)chip + 0x4a8c) =
             "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
             [uVar10];
        *(UINT8 *)((long)chip + 0x4a8d) = eg_rate_select[uVar10];
        uVar4 = uVar4 + *(int *)((long)chip + 0x4a60);
        *(UINT8 *)((long)chip + 0x4a8e) =
             "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
             [uVar4];
        *(UINT8 *)((long)chip + 0x4a8f) = eg_rate_select[uVar4];
      }
      iVar8 = *(int *)(*(long *)((long)chip + 0x49f8) + (ulong)*(byte *)((long)chip + 0x58d) * 4) +
              *(int *)((long)chip + 0x580);
      if (iVar8 < 0) {
        iVar8 = iVar8 + *(int *)((long)chip + 0x45e8);
      }
      *(uint *)((long)chip + 0x4a20) = (uint)(iVar8 * *(int *)((long)chip + 0x4a18)) >> 1;
      bVar3 = *(byte *)((long)chip + 0x58d) >> (*(byte *)((long)chip + 0x4a00) & 0x1f);
      uVar4 = (uint)bVar3;
      if (uVar4 != *(byte *)((long)chip + 0x4a14)) {
        *(byte *)((long)chip + 0x4a14) = bVar3;
        uVar10 = *(int *)((long)chip + 0x4a04) + uVar4;
        if (uVar10 < 0x5e) {
          UVar7 = "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                  [uVar10];
          UVar13 = eg_rate_select[uVar10];
        }
        else {
          UVar13 = 0x90;
          UVar7 = '\0';
        }
        *(UINT8 *)((long)chip + 19000) = UVar7;
        *(UINT8 *)((long)chip + 0x4a39) = UVar13;
        uVar10 = *(int *)((long)chip + 0x4a08) + uVar4;
        pUVar11 = 
        "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
        ;
        *(UINT8 *)((long)chip + 0x4a3a) =
             "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
             [uVar10];
        *(UINT8 *)((long)chip + 0x4a3b) = eg_rate_select[uVar10];
        uVar10 = *(int *)((long)chip + 0x4a0c) + uVar4;
        *(UINT8 *)((long)chip + 0x4a3c) =
             "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
             [uVar10];
        *(UINT8 *)((long)chip + 0x4a3d) = eg_rate_select[uVar10];
        uVar4 = uVar4 + *(int *)((long)chip + 0x4a10);
        *(UINT8 *)((long)chip + 0x4a3e) =
             "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
             [uVar4];
        *(UINT8 *)((long)chip + 0x4a3f) = eg_rate_select[uVar4];
      }
      iVar8 = *(int *)(*(long *)((long)chip + 0x4a98) + (ulong)*(byte *)((long)chip + 0x4b30) * 4) +
              *(int *)((long)chip + 0x4b2c);
      if (iVar8 < 0) {
        iVar8 = iVar8 + *(int *)((long)chip + 0x45e8);
      }
      *(uint *)((long)chip + 0x4ac0) = (uint)(iVar8 * *(int *)((long)chip + 0x4ab8)) >> 1;
      bVar3 = *(byte *)((long)chip + 0x4b30) >> (*(byte *)((long)chip + 0x4aa0) & 0x1f);
      uVar4 = (uint)bVar3;
      if (uVar4 != *(byte *)((long)chip + 0x4ab4)) {
        *(byte *)((long)chip + 0x4ab4) = bVar3;
        uVar10 = *(int *)((long)chip + 0x4aa4) + uVar4;
        if (uVar10 < 0x5e) {
          UVar7 = "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                  [uVar10];
          UVar13 = eg_rate_select[uVar10];
        }
        else {
          UVar13 = 0x90;
          UVar7 = '\0';
        }
        *(UINT8 *)((long)chip + 0x4ad8) = UVar7;
        *(UINT8 *)((long)chip + 0x4ad9) = UVar13;
        uVar10 = *(int *)((long)chip + 0x4aa8) + uVar4;
        pUVar11 = 
        "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
        ;
        *(UINT8 *)((long)chip + 0x4ada) =
             "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
             [uVar10];
        *(UINT8 *)((long)chip + 0x4adb) = eg_rate_select[uVar10];
        uVar10 = *(int *)((long)chip + 0x4aac) + uVar4;
        *(UINT8 *)((long)chip + 0x4adc) =
             "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
             [uVar10];
        *(UINT8 *)((long)chip + 0x4add) = eg_rate_select[uVar10];
        uVar4 = uVar4 + *(int *)((long)chip + 0x4ab0);
        *(UINT8 *)((long)chip + 0x4ade) =
             "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
             [uVar4];
        *(UINT8 *)((long)chip + 0x4adf) = eg_rate_select[uVar4];
      }
    }
  }
  if (length == 0) {
    lVar6 = 0;
    do {
      bVar3 = *(byte *)((long)chip + lVar6 + 0x46c0);
      if ((((bVar3 & 8) != 0) &&
          (uVar4 = *(uint *)((long)chip + lVar6 + 0x46ac), 0x1ff < (int)uVar4)) &&
         (bVar2 = *(byte *)((long)chip + lVar6 + 0x46a4), 1 < bVar2)) {
        if ((bVar3 & 1) == 0) {
          if ((bVar3 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar6 + 0x469c) = 0;
          }
          else {
            pbVar1 = (byte *)((long)chip + lVar6 + 0x46c1);
            *pbVar1 = *pbVar1 ^ 4;
          }
          if (bVar2 != 4) {
            if ((uint)*(byte *)((long)chip + lVar6 + 0x4694) + *(int *)((long)chip + lVar6 + 0x4684)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar6 + 0x46a4) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar6 + 0x46ac) = 0;
              *(byte *)((long)chip + lVar6 + 0x46a4) =
                   *(int *)((long)chip + lVar6 + 0x46b0) == 0 ^ 3;
              uVar4 = 0;
            }
          }
        }
        else {
          if ((bVar3 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar6 + 0x46c1) = 4;
          }
          if ((bVar2 != 4) && (*(byte *)((long)chip + lVar6 + 0x46c1) == (bVar3 & 4))) {
            *(undefined4 *)((long)chip + lVar6 + 0x46ac) = 0x3ff;
            uVar4 = 0x3ff;
          }
        }
        uVar10 = 0x200 - uVar4 & 0x3ff;
        if (*(byte *)((long)chip + lVar6 + 0x46c1) == (bVar3 & 4)) {
          uVar10 = uVar4;
        }
        *(uint *)((long)chip + lVar6 + 0x46b4) = uVar10 + *(int *)((long)chip + lVar6 + 0x46a8);
      }
      lVar6 = lVar6 + 0x50;
    } while ((int)lVar6 != 0x140);
    lVar6 = 0;
    do {
      bVar3 = *(byte *)((long)chip + lVar6 + 0x4858);
      if ((((bVar3 & 8) != 0) &&
          (uVar4 = *(uint *)((long)chip + lVar6 + 0x4844), 0x1ff < (int)uVar4)) &&
         (bVar2 = *(byte *)((long)chip + lVar6 + 0x483c), 1 < bVar2)) {
        if ((bVar3 & 1) == 0) {
          if ((bVar3 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar6 + 0x4834) = 0;
          }
          else {
            pbVar1 = (byte *)((long)chip + lVar6 + 0x4859);
            *pbVar1 = *pbVar1 ^ 4;
          }
          if (bVar2 != 4) {
            if ((uint)*(byte *)((long)chip + lVar6 + 0x482c) + *(int *)((long)chip + lVar6 + 0x481c)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar6 + 0x483c) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar6 + 0x4844) = 0;
              *(byte *)((long)chip + lVar6 + 0x483c) =
                   *(int *)((long)chip + lVar6 + 0x4848) == 0 ^ 3;
              uVar4 = 0;
            }
          }
        }
        else {
          if ((bVar3 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar6 + 0x4859) = 4;
          }
          if ((bVar2 != 4) && (*(byte *)((long)chip + lVar6 + 0x4859) == (bVar3 & 4))) {
            *(undefined4 *)((long)chip + lVar6 + 0x4844) = 0x3ff;
            uVar4 = 0x3ff;
          }
        }
        uVar10 = 0x200 - uVar4 & 0x3ff;
        if (*(byte *)((long)chip + lVar6 + 0x4859) == (bVar3 & 4)) {
          uVar10 = uVar4;
        }
        *(uint *)((long)chip + lVar6 + 0x484c) = uVar10 + *(int *)((long)chip + lVar6 + 0x4840);
      }
      lVar6 = lVar6 + 0x50;
    } while ((int)lVar6 != 0x140);
    lVar6 = 0;
    do {
      bVar3 = *(byte *)((long)chip + lVar6 + 0x49f0);
      if ((((bVar3 & 8) != 0) &&
          (uVar4 = *(uint *)((long)chip + lVar6 + 0x49dc), 0x1ff < (int)uVar4)) &&
         (bVar2 = *(byte *)((long)chip + lVar6 + 0x49d4), 1 < bVar2)) {
        if ((bVar3 & 1) == 0) {
          if ((bVar3 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar6 + 0x49cc) = 0;
          }
          else {
            pbVar1 = (byte *)((long)chip + lVar6 + 0x49f1);
            *pbVar1 = *pbVar1 ^ 4;
          }
          if (bVar2 != 4) {
            if ((uint)*(byte *)((long)chip + lVar6 + 0x49c4) + *(int *)((long)chip + lVar6 + 0x49b4)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar6 + 0x49d4) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar6 + 0x49dc) = 0;
              *(byte *)((long)chip + lVar6 + 0x49d4) =
                   *(int *)((long)chip + lVar6 + 0x49e0) == 0 ^ 3;
              uVar4 = 0;
            }
          }
        }
        else {
          if ((bVar3 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar6 + 0x49f1) = 4;
          }
          if ((bVar2 != 4) && (*(byte *)((long)chip + lVar6 + 0x49f1) == (bVar3 & 4))) {
            *(undefined4 *)((long)chip + lVar6 + 0x49dc) = 0x3ff;
            uVar4 = 0x3ff;
          }
        }
        uVar10 = 0x200 - uVar4 & 0x3ff;
        if (*(byte *)((long)chip + lVar6 + 0x49f1) == (bVar3 & 4)) {
          uVar10 = uVar4;
        }
        *(uint *)((long)chip + lVar6 + 0x49e4) = uVar10 + *(int *)((long)chip + lVar6 + 0x49d8);
      }
      lVar6 = lVar6 + 0x50;
    } while ((int)lVar6 != 0x140);
    *(undefined8 *)((long)chip + 0x45fc) = 0;
  }
  else {
    *(undefined8 *)((long)chip + 0x45fc) = 0;
    uVar12 = 0;
    do {
      *(undefined8 *)((long)chip + 0x4614) = 0;
      *(undefined4 *)((long)chip + 0x461c) = 0;
      lVar6 = 0;
      do {
        bVar3 = *(byte *)((long)chip + lVar6 + 0x46c0);
        if ((((bVar3 & 8) != 0) &&
            (uVar4 = *(uint *)((long)chip + lVar6 + 0x46ac), pUVar11 = (UINT8 *)(ulong)uVar4,
            0x1ff < (int)uVar4)) && (bVar2 = *(byte *)((long)chip + lVar6 + 0x46a4), 1 < bVar2)) {
          if ((bVar3 & 1) == 0) {
            if ((bVar3 & 2) == 0) {
              *(undefined4 *)((long)chip + lVar6 + 0x469c) = 0;
            }
            else {
              pbVar1 = (byte *)((long)chip + lVar6 + 0x46c1);
              *pbVar1 = *pbVar1 ^ 4;
            }
            if (bVar2 != 4) {
              if ((uint)*(byte *)((long)chip + lVar6 + 0x4694) +
                  *(int *)((long)chip + lVar6 + 0x4684) < 0x5e) {
                *(undefined1 *)((long)chip + lVar6 + 0x46a4) = 4;
              }
              else {
                *(undefined4 *)((long)chip + lVar6 + 0x46ac) = 0;
                *(byte *)((long)chip + lVar6 + 0x46a4) =
                     *(int *)((long)chip + lVar6 + 0x46b0) == 0 ^ 3;
                pUVar11 = (UINT8 *)0x0;
              }
            }
          }
          else {
            if ((bVar3 & 2) != 0) {
              *(undefined1 *)((long)chip + lVar6 + 0x46c1) = 4;
            }
            if ((bVar2 != 4) && (*(byte *)((long)chip + lVar6 + 0x46c1) == (bVar3 & 4))) {
              *(undefined4 *)((long)chip + lVar6 + 0x46ac) = 0x3ff;
              pUVar11 = (UINT8 *)0x3ff;
            }
          }
          uVar4 = 0x200 - (uint)pUVar11 & 0x3ff;
          if (*(byte *)((long)chip + lVar6 + 0x46c1) == (bVar3 & 4)) {
            uVar4 = (uint)pUVar11;
          }
          *(uint *)((long)chip + lVar6 + 0x46b4) = uVar4 + *(int *)((long)chip + lVar6 + 0x46a8);
        }
        lVar6 = lVar6 + 0x50;
      } while ((int)lVar6 != 0x140);
      lVar6 = 0;
      do {
        bVar3 = *(byte *)((long)chip + lVar6 + 0x4858);
        if ((((bVar3 & 8) != 0) &&
            (uVar4 = *(uint *)((long)chip + lVar6 + 0x4844), pUVar11 = (UINT8 *)(ulong)uVar4,
            0x1ff < (int)uVar4)) && (bVar2 = *(byte *)((long)chip + lVar6 + 0x483c), 1 < bVar2)) {
          if ((bVar3 & 1) == 0) {
            if ((bVar3 & 2) == 0) {
              *(undefined4 *)((long)chip + lVar6 + 0x4834) = 0;
            }
            else {
              pbVar1 = (byte *)((long)chip + lVar6 + 0x4859);
              *pbVar1 = *pbVar1 ^ 4;
            }
            if (bVar2 != 4) {
              if ((uint)*(byte *)((long)chip + lVar6 + 0x482c) +
                  *(int *)((long)chip + lVar6 + 0x481c) < 0x5e) {
                *(undefined1 *)((long)chip + lVar6 + 0x483c) = 4;
              }
              else {
                *(undefined4 *)((long)chip + lVar6 + 0x4844) = 0;
                *(byte *)((long)chip + lVar6 + 0x483c) =
                     *(int *)((long)chip + lVar6 + 0x4848) == 0 ^ 3;
                pUVar11 = (UINT8 *)0x0;
              }
            }
          }
          else {
            if ((bVar3 & 2) != 0) {
              *(undefined1 *)((long)chip + lVar6 + 0x4859) = 4;
            }
            if ((bVar2 != 4) && (*(byte *)((long)chip + lVar6 + 0x4859) == (bVar3 & 4))) {
              *(undefined4 *)((long)chip + lVar6 + 0x4844) = 0x3ff;
              pUVar11 = (UINT8 *)0x3ff;
            }
          }
          uVar4 = 0x200 - (uint)pUVar11 & 0x3ff;
          if (*(byte *)((long)chip + lVar6 + 0x4859) == (bVar3 & 4)) {
            uVar4 = (uint)pUVar11;
          }
          *(uint *)((long)chip + lVar6 + 0x484c) = uVar4 + *(int *)((long)chip + lVar6 + 0x4840);
        }
        lVar6 = lVar6 + 0x50;
      } while ((int)lVar6 != 0x140);
      lVar6 = 0;
      do {
        bVar3 = *(byte *)((long)chip + lVar6 + 0x49f0);
        if ((((bVar3 & 8) != 0) &&
            (uVar4 = *(uint *)((long)chip + lVar6 + 0x49dc), pUVar11 = (UINT8 *)(ulong)uVar4,
            0x1ff < (int)uVar4)) && (bVar2 = *(byte *)((long)chip + lVar6 + 0x49d4), 1 < bVar2)) {
          if ((bVar3 & 1) == 0) {
            if ((bVar3 & 2) == 0) {
              *(undefined4 *)((long)chip + lVar6 + 0x49cc) = 0;
            }
            else {
              pbVar1 = (byte *)((long)chip + lVar6 + 0x49f1);
              *pbVar1 = *pbVar1 ^ 4;
            }
            if (bVar2 != 4) {
              if ((uint)*(byte *)((long)chip + lVar6 + 0x49c4) +
                  *(int *)((long)chip + lVar6 + 0x49b4) < 0x5e) {
                *(undefined1 *)((long)chip + lVar6 + 0x49d4) = 4;
              }
              else {
                *(undefined4 *)((long)chip + lVar6 + 0x49dc) = 0;
                *(byte *)((long)chip + lVar6 + 0x49d4) =
                     *(int *)((long)chip + lVar6 + 0x49e0) == 0 ^ 3;
                pUVar11 = (UINT8 *)0x0;
              }
            }
          }
          else {
            if ((bVar3 & 2) != 0) {
              *(undefined1 *)((long)chip + lVar6 + 0x49f1) = 4;
            }
            if ((bVar2 != 4) && (*(byte *)((long)chip + lVar6 + 0x49f1) == (bVar3 & 4))) {
              *(undefined4 *)((long)chip + lVar6 + 0x49dc) = 0x3ff;
              pUVar11 = (UINT8 *)0x3ff;
            }
          }
          uVar4 = 0x200 - (uint)pUVar11 & 0x3ff;
          if (*(byte *)((long)chip + lVar6 + 0x49f1) == (bVar3 & 4)) {
            uVar4 = (uint)pUVar11;
          }
          *(uint *)((long)chip + lVar6 + 0x49e4) = uVar4 + *(int *)((long)chip + lVar6 + 0x49d8);
        }
        lVar6 = lVar6 + 0x50;
      } while ((int)lVar6 != 0x140);
      chan_calc(OPN,CH,(int)pUVar11);
      chan_calc(OPN,CH_00,chnum);
      chan_calc(OPN,CH_01,chnum_00);
      uVar4 = *(uint *)((long)chip + 0x5e4);
      uVar10 = *(int *)((long)chip + 0x5dc) + *(int *)((long)chip + 0x5e0);
      *(uint *)((long)chip + 0x5dc) = uVar10;
      pUVar11 = extraout_RDX_01;
      while (uVar4 <= uVar10) {
        *(uint *)((long)chip + 0x5dc) = uVar10 - uVar4;
        *(int *)((long)chip + 0x5d8) = *(int *)((long)chip + 0x5d8) + 1;
        advance_eg_channel(OPN,(FM_SLOT *)CH);
        advance_eg_channel(OPN,(FM_SLOT *)CH_00);
        advance_eg_channel(OPN,(FM_SLOT *)CH_01);
        uVar10 = *(uint *)((long)chip + 0x5dc);
        pUVar11 = extraout_RDX_02;
        uVar4 = *(uint *)((long)chip + 0x5e4);
      }
      iVar8 = *(int *)((long)chip + 0x4618) + *(int *)((long)chip + 0x4614) +
              *(int *)((long)chip + 0x461c);
      local_48[uVar12] = iVar8;
      local_40[uVar12] = iVar8;
      *(char *)((long)chip + 0x59c) = *(char *)((long)chip + 0x59c) << 1;
      iVar8 = *(int *)((long)chip + 0x13c);
      if (((iVar8 != 0) && (*(long *)((long)chip + 0x548) == 0)) &&
         (iVar9 = (int)(*(double *)((long)chip + 0x120) * 4096.0), iVar5 = iVar8 - iVar9,
         *(int *)((long)chip + 0x13c) = iVar5, iVar5 == 0 || iVar8 < iVar9)) {
        if ((*(byte *)((long)chip + 0x130) & 4) == 0) {
LAB_00127f41:
          iVar8 = 0x400 - *(int *)((long)chip + 0x138);
        }
        else {
          bVar3 = *(byte *)((long)chip + 0x12f) | 1;
          *(byte *)((long)chip + 0x12f) = bVar3;
          if ((*(char *)((long)chip + 0x12d) != '\0') ||
             ((*(byte *)((long)chip + 0x12e) & bVar3) == 0)) goto LAB_00127f41;
          *(undefined1 *)((long)chip + 0x12d) = 1;
          if (*(code **)((long)chip + 0x550) == (code *)0x0) goto LAB_00127f41;
          (**(code **)((long)chip + 0x550))(*(undefined8 *)((long)chip + 0x110),1);
          iVar8 = 0x400 - *(int *)((long)chip + 0x138);
          *(int *)((long)chip + 0x13c) = iVar8;
          if (*(code **)((long)chip + 0x548) != (code *)0x0) {
            (**(code **)((long)chip + 0x548))
                      (*(undefined8 *)((long)chip + 0x110),0,iVar8 * *(int *)((long)chip + 0x128),
                       *(undefined4 *)((long)chip + 0x118));
            iVar8 = *(int *)((long)chip + 0x13c);
          }
        }
        pUVar11 = (UINT8 *)(ulong)(uint)(iVar8 << 0xc);
        *(int *)((long)chip + 0x13c) = iVar8 << 0xc;
        if ((*(uint *)((long)chip + 0x130) & 0xc0) == 0x80) {
          CSMKeyControl(OPN,CH_01);
          pUVar11 = extraout_RDX_03;
        }
      }
      if ((*(byte *)((long)chip + 0x59c) & 2) != 0) {
        if ((*(char *)((long)chip + 0x49f2) == '\0') && (1 < *(byte *)((long)chip + 0x49d4))) {
          *(undefined1 *)((long)chip + 0x49d4) = 1;
          if ((*(byte *)((long)chip + 0x49f0) & 8) != 0) {
            pUVar11 = (UINT8 *)(ulong)*(byte *)((long)chip + 0x49f1);
            uVar4 = *(uint *)((long)chip + 0x49dc);
            if ((*(byte *)((long)chip + 0x49f0) & 4) != *(byte *)((long)chip + 0x49f1)) {
              uVar4 = 0x200 - uVar4 & 0x3ff;
              *(uint *)((long)chip + 0x49dc) = uVar4;
            }
            if (0x1ff < (int)uVar4) {
              *(undefined4 *)((long)chip + 0x49dc) = 0x3ff;
              *(undefined1 *)((long)chip + 0x49d4) = 0;
              uVar4 = 0x3ff;
            }
            *(uint *)((long)chip + 0x49e4) = uVar4 + *(int *)((long)chip + 0x49d8);
          }
        }
        if ((*(char *)((long)chip + 0x4a92) == '\0') && (1 < *(byte *)((long)chip + 0x4a74))) {
          *(undefined1 *)((long)chip + 0x4a74) = 1;
          if ((*(byte *)((long)chip + 0x4a90) & 8) != 0) {
            pUVar11 = (UINT8 *)(ulong)*(byte *)((long)chip + 0x4a91);
            uVar4 = *(uint *)((long)chip + 0x4a7c);
            if ((*(byte *)((long)chip + 0x4a90) & 4) != *(byte *)((long)chip + 0x4a91)) {
              uVar4 = 0x200 - uVar4 & 0x3ff;
              *(uint *)((long)chip + 0x4a7c) = uVar4;
            }
            if (0x1ff < (int)uVar4) {
              *(undefined4 *)((long)chip + 0x4a7c) = 0x3ff;
              *(undefined1 *)((long)chip + 0x4a74) = 0;
              uVar4 = 0x3ff;
            }
            *(uint *)((long)chip + 0x4a84) = uVar4 + *(int *)((long)chip + 0x4a78);
          }
        }
        if ((*(char *)((long)chip + 0x4a42) == '\0') && (1 < *(byte *)((long)chip + 0x4a24))) {
          *(undefined1 *)((long)chip + 0x4a24) = 1;
          if ((*(byte *)((long)chip + 0x4a40) & 8) != 0) {
            pUVar11 = (UINT8 *)(ulong)*(byte *)((long)chip + 0x4a41);
            uVar4 = *(uint *)((long)chip + 0x4a2c);
            if ((*(byte *)((long)chip + 0x4a40) & 4) != *(byte *)((long)chip + 0x4a41)) {
              uVar4 = 0x200 - uVar4 & 0x3ff;
              *(uint *)((long)chip + 0x4a2c) = uVar4;
            }
            if (0x1ff < (int)uVar4) {
              *(undefined4 *)((long)chip + 0x4a2c) = 0x3ff;
              *(undefined1 *)((long)chip + 0x4a24) = 0;
              uVar4 = 0x3ff;
            }
            *(uint *)((long)chip + 0x4a34) = uVar4 + *(int *)((long)chip + 0x4a28);
          }
        }
        if ((*(char *)((long)chip + 0x4ae2) == '\0') && (1 < *(byte *)((long)chip + 0x4ac4))) {
          *(undefined1 *)((long)chip + 0x4ac4) = 1;
          if ((*(byte *)((long)chip + 0x4ae0) & 8) != 0) {
            pUVar11 = (UINT8 *)(ulong)*(byte *)((long)chip + 0x4ae1);
            uVar4 = *(uint *)((long)chip + 0x4acc);
            if ((*(byte *)((long)chip + 0x4ae0) & 4) != *(byte *)((long)chip + 0x4ae1)) {
              uVar4 = 0x200 - uVar4 & 0x3ff;
              *(uint *)((long)chip + 0x4acc) = uVar4;
            }
            if (0x1ff < (int)uVar4) {
              *(undefined4 *)((long)chip + 0x4acc) = 0x3ff;
              *(undefined1 *)((long)chip + 0x4ac4) = 0;
              uVar4 = 0x3ff;
            }
            *(uint *)((long)chip + 0x4ad4) = uVar4 + *(int *)((long)chip + 0x4ac8);
          }
        }
        *(undefined1 *)((long)chip + 0x59c) = 0;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != length);
  }
  iVar8 = *(int *)((long)chip + 0x144);
  if (iVar8 == 0) {
    return;
  }
  if (*(long *)((long)chip + 0x548) != 0) {
    return;
  }
  iVar9 = (int)((double)length * *(double *)((long)chip + 0x120) * 4096.0);
  iVar5 = iVar8 - iVar9;
  *(int *)((long)chip + 0x144) = iVar5;
  if (iVar5 != 0 && iVar9 <= iVar8) {
    return;
  }
  if ((*(byte *)((long)chip + 0x130) & 8) != 0) {
    bVar3 = *(byte *)((long)chip + 0x12f) | 2;
    *(byte *)((long)chip + 0x12f) = bVar3;
    if ((*(char *)((long)chip + 0x12d) == '\0') && ((*(byte *)((long)chip + 0x12e) & bVar3) != 0)) {
      *(undefined1 *)((long)chip + 0x12d) = 1;
      if (*(code **)((long)chip + 0x550) != (code *)0x0) {
        (**(code **)((long)chip + 0x550))(*(undefined8 *)((long)chip + 0x110),1);
        iVar8 = (uint)*(byte *)((long)chip + 0x140) * -0x10 + 0x1000;
        *(int *)((long)chip + 0x144) = iVar8;
        if (*(code **)((long)chip + 0x548) != (code *)0x0) {
          (**(code **)((long)chip + 0x548))
                    (*(undefined8 *)((long)chip + 0x110),1,iVar8 * *(int *)((long)chip + 0x128),
                     *(undefined4 *)((long)chip + 0x118));
          iVar8 = *(int *)((long)chip + 0x144);
        }
        goto LAB_00128257;
      }
    }
  }
  iVar8 = (uint)*(byte *)((long)chip + 0x140) * -0x10 + 0x1000;
LAB_00128257:
  *(int *)((long)chip + 0x144) = iVar8 << 0xc;
  return;
}

Assistant:

void ym2203_update_one(void *chip, UINT32 length, DEV_SMPL **buffer)
{
	YM2203 *F2203 = (YM2203 *)chip;
	FM_OPN *OPN =   &F2203->OPN;
	UINT32 i;
	DEV_SMPL  *bufL,*bufR;
	FM_CH   *cch[3];

	if (buffer != NULL)
	{
		bufL = buffer[0];
		bufR = buffer[1];
	}
	else
	{
		bufL = bufR = NULL;
	}
	cch[0]   = &F2203->CH[0];
	cch[1]   = &F2203->CH[1];
	cch[2]   = &F2203->CH[2];


	/* refresh PG and EG */
	refresh_fc_eg_chan( OPN, cch[0] );
	refresh_fc_eg_chan( OPN, cch[1] );
	if( (OPN->ST.mode & 0xc0) )
	{
		/* 3SLOT MODE */
		if( cch[2]->SLOT[SLOT1].Incr==-1)
		{
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT1] , OPN->SL3.fc[1] , OPN->SL3.kcode[1] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT2] , OPN->SL3.fc[2] , OPN->SL3.kcode[2] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT3] , OPN->SL3.fc[0] , OPN->SL3.kcode[0] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT4] , cch[2]->fc , cch[2]->kcode );
		}
	}
	else
		refresh_fc_eg_chan( OPN, cch[2] );
	if (! length)
	{
		update_ssg_eg_channel(&cch[0]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[1]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[2]->SLOT[SLOT1]);
	}


	/* YM2203 doesn't have LFO so we must keep these globals at 0 level */
	OPN->LFO_AM = 0;
	OPN->LFO_PM = 0;

	/* buffering */
	for (i=0; i < length ; i++)
	{
		/* clear outputs */
		OPN->out_fm[0] = 0;
		OPN->out_fm[1] = 0;
		OPN->out_fm[2] = 0;

		/* update SSG-EG output */
		update_ssg_eg_channel(&cch[0]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[1]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[2]->SLOT[SLOT1]);

		/* calculate FM */
		chan_calc(OPN, cch[0], 0 );
		chan_calc(OPN, cch[1], 1 );
		chan_calc(OPN, cch[2], 2 );

		/* advance envelope generator */
		OPN->eg_timer += OPN->eg_timer_add;
		while (OPN->eg_timer >= OPN->eg_timer_overflow)
		{
			OPN->eg_timer -= OPN->eg_timer_overflow;
			OPN->eg_cnt++;

			advance_eg_channel(OPN, &cch[0]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[1]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[2]->SLOT[SLOT1]);
		}

		/* buffering */
		{
			DEV_SMPL lt;

			lt = OPN->out_fm[0] + OPN->out_fm[1] + OPN->out_fm[2];

			/* buffering */
			bufL[i] = lt;
			bufR[i] = lt;
		}

		/* CSM mode: if CSM Key ON has occured, CSM Key OFF need to be sent       */
		/* only if Timer A does not overflow again (i.e CSM Key ON not set again) */
		OPN->SL3.key_csm <<= 1;

		/* timer A control */
		INTERNAL_TIMER_A( &OPN->ST , cch[2] )

		/* CSM Mode Key ON still disabled */
		if (OPN->SL3.key_csm & 2)
		{
			/* CSM Mode Key OFF (verified by Nemesis on real hardware) */
			FM_KEYOFF_CSM(cch[2],SLOT1);
			FM_KEYOFF_CSM(cch[2],SLOT2);
			FM_KEYOFF_CSM(cch[2],SLOT3);
			FM_KEYOFF_CSM(cch[2],SLOT4);
			OPN->SL3.key_csm = 0;
		}
	}

	/* timer B control */
	INTERNAL_TIMER_B(&OPN->ST,length)
}